

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

void __thiscall apngasm::APNGAsm::processing_data(APNGAsm *this,uchar *p,uint size)

{
  int iVar1;
  __jmp_buf_tag *__env;
  
  if ((this->_png != (png_structp)0x0) && (this->_info != (png_infop)0x0)) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(this->_png,longjmp,200);
    iVar1 = _setjmp(__env);
    if (iVar1 == 0) {
      png_process_data(this->_png,this->_info,p,size);
    }
    else {
      png_destroy_read_struct(&this->_png,&this->_info,0);
    }
  }
  return;
}

Assistant:

void APNGAsm::processing_data(unsigned char * p, unsigned int size)
  {
    if (!_png || !_info)
      return;

    if (setjmp(png_jmpbuf(_png)))
    {
      png_destroy_read_struct(&_png, &_info, 0);
      return;
    }

    png_process_data(_png, _info, p, size);
  }